

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::GenerateGraphViz(cmake *this,string *fileName)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string fallbackSettingsFile;
  string settingsFile;
  cmGraphVizWriter gvWriter;
  string local_488;
  string local_468;
  basic_string_view<char,_std::char_traits<char>_> local_448;
  undefined8 local_438;
  char *local_430;
  cmGraphVizWriter local_428;
  
  cmGraphVizWriter::cmGraphVizWriter
            (&local_428,fileName,
             (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_448._M_str = (psVar1->_M_dataplus)._M_p;
  local_448._M_len = psVar1->_M_string_length;
  local_438 = 0x1b;
  local_430 = "/CMakeGraphVizOptions.cmake";
  views._M_len = 2;
  views._M_array = &local_448;
  cmCatViews_abi_cxx11_(&local_468,views);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_448._M_str = (psVar1->_M_dataplus)._M_p;
  local_448._M_len = psVar1->_M_string_length;
  local_438 = 0x1b;
  local_430 = "/CMakeGraphVizOptions.cmake";
  views_00._M_len = 2;
  views_00._M_array = &local_448;
  cmCatViews_abi_cxx11_(&local_488,views_00);
  cmGraphVizWriter::ReadSettings(&local_428,&local_468,&local_488);
  cmGraphVizWriter::Write(&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  cmGraphVizWriter::~cmGraphVizWriter(&local_428);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const std::string& fileName) const
{
#ifndef CMAKE_BOOTSTRAP
  cmGraphVizWriter gvWriter(fileName, this->GetGlobalGenerator());

  std::string settingsFile =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeGraphVizOptions.cmake");
  std::string fallbackSettingsFile =
    cmStrCat(this->GetHomeDirectory(), "/CMakeGraphVizOptions.cmake");

  gvWriter.ReadSettings(settingsFile, fallbackSettingsFile);

  gvWriter.Write();

#endif
}